

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void mine(defyx_vm *vm,atomic<unsigned_int> *atomicNonce,AtomicHash *result,uint32_t noncesCount,
         int thread,int cpuid)

{
  int iVar1;
  ostream *poVar2;
  uint in_ECX;
  uint64_t *in_RSI;
  int in_R8D;
  int in_R9D;
  __int_type_conflict nonce;
  void *noncePtr;
  uint8_t blockTemplate [76];
  uint64_t hash [4];
  int rc;
  uint *in_stack_fffffffffffffef0;
  uint64_t *in_stack_fffffffffffffef8;
  AtomicHash *in_stack_ffffffffffffff00;
  uint local_e4;
  uint8_t local_b8 [16];
  void *output;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff74;
  
  if ((-1 < in_R9D) && (iVar1 = set_thread_affinity(in_stack_fffffffffffffef0), iVar1 != 0)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to set thread affinity for thread ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_R8D);
    poVar2 = std::operator<<(poVar2," (error=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  uVar5 = 0xd25cf9ee;
  uVar6 = 0x2fc1ef0c;
  uVar7 = 0x961d561;
  output = (void *)0xadfbf6bced4b1a5;
  uVar3 = 0xde8bc3ca;
  uVar4 = 0xcd2d4dd3;
  local_b8[0] = 'O';
  local_b8[1] = 0x85;
  local_b8[2] = '?';
  local_b8[3] = '\0';
  local_b8[4] = '+';
  local_b8[5] = '.';
  local_b8[6] = 0xea;
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = 'w';
  local_b8[0xc] = 0xb2;
  local_b8[0xd] = '\x06';
  local_b8[0xe] = 0xa0;
  local_b8[0xf] = ',';
  LOCK();
  local_e4 = (uint)*in_RSI;
  *(int *)in_RSI = (int)*in_RSI + 1;
  UNLOCK();
  while (local_e4 < in_ECX) {
    store32(local_b8 + 7,local_e4);
    defyx_calculate_hash
              ((defyx_vm *)CONCAT44(in_stack_ffffffffffffff74,uVar7),(void *)CONCAT44(uVar6,uVar5),
               CONCAT44(uVar4,uVar3),output);
    AtomicHash::xorWith(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff00 = (AtomicHash *)0x4;
    LOCK();
    local_e4 = (uint)*in_RSI;
    *(int *)in_RSI = (int)*in_RSI + 1;
    UNLOCK();
    in_stack_fffffffffffffef8 = in_RSI;
  }
  return;
}

Assistant:

void mine(defyx_vm* vm, std::atomic<uint32_t>& atomicNonce, AtomicHash& result, uint32_t noncesCount, int thread, int cpuid=-1) {
	if (cpuid >= 0) {
		int rc = set_thread_affinity(cpuid);
		if (rc) {
			std::cerr << "Failed to set thread affinity for thread " << thread << " (error=" << rc << ")" <<  std::endl;
		}
	}
	uint64_t hash[RANDOMX_HASH_SIZE / sizeof(uint64_t)];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	void* noncePtr = blockTemplate + 39;
	auto nonce = atomicNonce.fetch_add(1);

	while (nonce < noncesCount) {
		store32(noncePtr, nonce);
		defyx_calculate_hash(vm, blockTemplate, sizeof(blockTemplate), &hash);
		result.xorWith(hash);
		nonce = atomicNonce.fetch_add(1);
	}
}